

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

int __thiscall
httplib::Stream::write_format<int,char_const*>(Stream *this,char *fmt,int *args,char **args_1)

{
  char *pcVar1;
  Stream *pSVar2;
  uint uVar3;
  value_type *__val;
  long lVar4;
  vector<char,_std::allocator<char>_> glowable_buf;
  array<char,_2048UL> buf;
  vector<char,_std::allocator<char>_> local_858;
  Stream *local_838;
  char local_830 [2048];
  
  uVar3 = snprintf(local_830,0x7ff,fmt,(ulong)(uint)*args,*args_1);
  if (0 < (int)uVar3) {
    if ((int)uVar3 < 0x7ff) {
      uVar3 = (*this->_vptr_Stream[3])(this,local_830,(ulong)uVar3);
    }
    else {
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x800);
      pcVar1 = local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x800;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar1;
      memset(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x800);
      lVar4 = (long)pcVar1 -
              (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
      pSVar2 = this;
      if ((int)lVar4 + -1 <= (int)uVar3) {
        do {
          local_838 = pSVar2;
          std::vector<char,_std::allocator<char>_>::resize(&local_858,lVar4 * 2);
          uVar3 = snprintf(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (size_t)(local_858.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_finish +
                                   ~(ulong)local_858.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start),fmt,
                           (ulong)(uint)*args,*args_1);
          lVar4 = (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          this = local_838;
          pSVar2 = local_838;
        } while ((int)lVar4 + -1 <= (int)uVar3);
      }
      uVar3 = (*this->_vptr_Stream[3])
                        (this,local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,(long)(int)uVar3);
      if (local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return uVar3;
}

Assistant:

inline int Stream::write_format(const char *fmt, const Args &... args) {
  std::array<char, 2048> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
  auto n = _snprintf_s(buf, bufsiz, buf.size() - 1, fmt, args...);
#else
  auto n = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
  if (n <= 0) { return n; }

  if (n >= static_cast<int>(buf.size()) - 1) {
    std::vector<char> glowable_buf(buf.size());

    while (n >= static_cast<int>(glowable_buf.size() - 1)) {
      glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
      n = _snprintf_s(&glowable_buf[0], glowable_buf.size(),
                      glowable_buf.size() - 1, fmt, args...);
#else
      n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
    }
    return write(&glowable_buf[0], n);
  } else {
    return write(buf.data(), n);
  }
}